

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

void __thiscall
slang::ast::UnpackedUnionType::UnpackedUnionType
          (UnpackedUnionType *this,Compilation *compilation,bool isTagged,SourceLocation loc,
          ASTContext *context)

{
  int iVar1;
  SymbolIndex SVar2;
  
  (this->super_Type).super_Symbol.kind = UnpackedUnionType;
  (this->super_Type).super_Symbol.name._M_len = 0;
  (this->super_Type).super_Symbol.name._M_str = "";
  (this->super_Type).super_Symbol.location = loc;
  (this->super_Type).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Type).super_Symbol.parentScope = (Scope *)0x0;
  (this->super_Type).super_Symbol.nextInScope = (Symbol *)0x0;
  (this->super_Type).super_Symbol.indexInScope = 0;
  (this->super_Type).canonical = &this->super_Type;
  Scope::Scope(&this->super_Scope,compilation,(Symbol *)this);
  this->selectableWidth = 0;
  this->bitstreamWidth = 0;
  (this->fields)._M_ptr = (pointer)0x0;
  (this->fields)._M_extent._M_extent_value = 0;
  iVar1 = compilation->nextUnionSystemId;
  compilation->nextUnionSystemId = iVar1 + 1;
  this->systemId = iVar1;
  this->isTagged = isTagged;
  SVar2 = context->lookupIndex;
  (this->super_Type).super_Symbol.parentScope = (context->scope).ptr;
  (this->super_Type).super_Symbol.indexInScope = SVar2;
  return;
}

Assistant:

UnpackedUnionType::UnpackedUnionType(Compilation& compilation, bool isTagged, SourceLocation loc,
                                     const ASTContext& context) :
    Type(SymbolKind::UnpackedUnionType, "", loc), Scope(compilation, this),
    systemId(compilation.getNextUnionSystemId()), isTagged(isTagged) {

    // Union types don't live as members of the parent scope (they're "owned" by
    // the declaration containing them) but we hook up the parent pointer so that
    // it can participate in name lookups.
    setParent(*context.scope, context.lookupIndex);
}